

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QDateTime *dateTime)

{
  int iVar1;
  Data DVar2;
  long lVar3;
  long in_FS_OFFSET;
  qint32 offset;
  Data local_38;
  Data local_30;
  qint8 ts;
  QTime local_24;
  QDate local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.jd = -0x8000000000000000;
  local_24.mds = -1;
  ts = '\0';
  local_30 = (Data)0x1;
  iVar1 = in->ver;
  if (iVar1 < 0xf) {
    if (iVar1 == 0xd) {
      operator>>(in,&local_20);
      operator>>(in,&local_24);
      QDataStream::operator>>(in,&ts);
      _offset = (Data)0x2;
      QDateTime::QDateTime
                ((QDateTime *)&local_38.data,local_20,local_24,(QTimeZone *)&offset,LegacyBehavior);
      DVar2.data = *(ShortData *)&dateTime->d;
      dateTime->d = local_38;
      local_38.data = DVar2.data;
      QDateTime::~QDateTime((QDateTime *)&local_38.data);
      QTimeZone::~QTimeZone((QTimeZone *)&offset);
      if (ts != '\0') goto LAB_00311c97;
      QDateTime::toTimeZone((QDateTime *)&local_38.data,(QTimeZone *)dateTime);
    }
    else if (iVar1 < 7) {
      operator>>(in,&local_20);
      operator>>(in,&local_24);
      QDateTime::QDateTime((QDateTime *)&local_38.data,local_20,local_24,LegacyBehavior);
    }
    else {
      operator>>(in,&local_20);
      operator>>(in,&local_24);
      QDataStream::operator>>(in,&ts);
      DVar2 = local_30;
      if ((ts & 0xfeU) == 2) {
        local_30 = (Data)0x2;
        local_38 = DVar2;
        QTimeZone::~QTimeZone((QTimeZone *)&local_38.data);
      }
      QDateTime::QDateTime
                ((QDateTime *)&local_38.data,local_20,local_24,(QTimeZone *)&local_30.data,
                 LegacyBehavior);
    }
  }
  else {
    operator>>(in,&local_20);
    operator>>(in,&local_24);
    QDataStream::operator>>(in,&ts);
    DVar2 = local_30;
    if (ts == '\x01') {
      local_30 = (Data)0x2;
      local_38 = DVar2;
LAB_00311c58:
      QTimeZone::~QTimeZone((QTimeZone *)&local_38.data);
    }
    else {
      if (ts == '\x02') {
        _offset = _offset & 0xffffffff00000000;
        QDataStream::operator>>(in,&offset);
        lVar3 = (long)offset;
        local_38 = local_30;
        local_30.d = (QDateTimePrivate *)0x0;
        if (lVar3 + 0xe100U < 0x1c201) {
          local_30.d = (QDateTimePrivate *)((3 - (ulong)(lVar3 == 0)) + lVar3 * 4);
        }
        goto LAB_00311c58;
      }
      if (ts == '\x03') {
        operator>>(in,(QTimeZone *)&local_30.data);
      }
    }
    QDateTime::QDateTime
              ((QDateTime *)&local_38.data,local_20,local_24,(QTimeZone *)&local_30.data,
               LegacyBehavior);
  }
  DVar2.data = *(ShortData *)&dateTime->d;
  dateTime->d = local_38;
  local_38.data = DVar2.data;
  QDateTime::~QDateTime((QDateTime *)&local_38.data);
LAB_00311c97:
  QTimeZone::~QTimeZone((QTimeZone *)&local_30.data);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QDateTime &dateTime)
{
    QDate dt;
    QTime tm;
    qint8 ts = 0;
    QTimeZone zone(QTimeZone::LocalTime);

    if (in.version() >= QDataStream::Qt_5_2) {

        // In 5.2 we switched to using Qt::TimeSpec and added offset and zone support
        in >> dt >> tm >> ts;
        switch (static_cast<Qt::TimeSpec>(ts)) {
        case Qt::UTC:
            zone = QTimeZone::UTC;
            break;
        case Qt::OffsetFromUTC: {
            qint32 offset = 0;
            in >> offset;
            zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            break;
        }
        case Qt::LocalTime:
            break;
        case Qt::TimeZone:
            in >> zone;
            break;
        }
        // Note: no way to resolve transition ambiguity, when relevant; use default.
        dateTime = QDateTime(dt, tm, zone);

    } else if (in.version() == QDataStream::Qt_5_0) {

        // In Qt 5.0 we incorrectly serialised all datetimes as UTC
        in >> dt >> tm >> ts;
        dateTime = QDateTime(dt, tm, QTimeZone::UTC);
        if (static_cast<Qt::TimeSpec>(ts) == Qt::LocalTime)
            dateTime = dateTime.toTimeZone(zone);

    } else if (in.version() >= QDataStream::Qt_4_0) {

        // From 4.0 to 5.1 (except 5.0) we used QDateTimePrivate::Spec
        in >> dt >> tm >> ts;
        switch (static_cast<QDateTimePrivate::Spec>(ts)) {
        case QDateTimePrivate::OffsetFromUTC: // No offset was stored, so treat as UTC.
        case QDateTimePrivate::UTC:
            zone = QTimeZone::UTC;
            break;
        case QDateTimePrivate::TimeZone: // No zone was stored, so treat as LocalTime:
        case QDateTimePrivate::LocalUnknown:
        case QDateTimePrivate::LocalStandard:
        case QDateTimePrivate::LocalDST:
            break;
        }
        dateTime = QDateTime(dt, tm, zone);

    } else { // version < QDataStream::Qt_4_0

        // Before 4.0 there was no TimeSpec, only Qt::LocalTime was supported
        in >> dt >> tm;
        dateTime = QDateTime(dt, tm);

    }

    return in;
}